

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

string * __thiscall
HighsMipSolverData::solutionSourceToString_abi_cxx11_
          (string *__return_storage_ptr__,HighsMipSolverData *this,int solution_source,bool code)

{
  char *pcVar1;
  char *pcVar2;
  
  switch(solution_source) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "B";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Branching";
      pcVar1 = "";
    }
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "C";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Central rounding";
      pcVar1 = "";
    }
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "F";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Feasibility pump";
      pcVar1 = "";
    }
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "H";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Heuristic";
      pcVar1 = "";
    }
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "L";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Sub-MIP";
      pcVar1 = "";
    }
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "P";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Empty MIP";
      pcVar1 = "";
    }
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "R";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Randomized rounding";
      pcVar1 = "";
    }
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "S";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Solve LP";
      pcVar1 = "";
    }
    break;
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "T";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Evaluate node";
      pcVar1 = "";
    }
    break;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "U";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Unbounded";
      pcVar1 = "";
    }
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "z";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Trivial zero";
      pcVar1 = "";
    }
    break;
  case 0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "l";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Trivial lower";
      pcVar1 = "";
    }
    break;
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "u";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Trivial upper";
      pcVar1 = "";
    }
    break;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "p";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Trivial point";
      pcVar1 = "";
    }
    break;
  case 0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "X";
      pcVar1 = "";
    }
    else {
      pcVar2 = "User solution";
      pcVar1 = "";
    }
    break;
  case 0xf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (!code) {
      pcVar1 = "";
      pcVar2 = "";
      break;
    }
LAB_002b52e5:
    pcVar2 = " ";
    pcVar1 = "";
    break;
  case -1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (!code) goto LAB_002b5485;
    goto LAB_002b52e5;
  default:
    printf("HighsMipSolverData::solutionSourceToString: Unknown source = %d\n",
           (ulong)(uint)solution_source);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (code) {
      pcVar2 = "*";
      pcVar1 = "";
      break;
    }
LAB_002b5485:
    pcVar2 = "None";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string HighsMipSolverData::solutionSourceToString(
    const int solution_source, const bool code) {
  if (solution_source == kSolutionSourceNone) {
    if (code) return " ";
    return "None";
  } else if (solution_source == kSolutionSourceBranching) {
    if (code) return "B";
    return "Branching";
  } else if (solution_source == kSolutionSourceCentralRounding) {
    if (code) return "C";
    return "Central rounding";
  } else if (solution_source == kSolutionSourceFeasibilityPump) {
    if (code) return "F";
    return "Feasibility pump";
  } else if (solution_source == kSolutionSourceHeuristic) {
    if (code) return "H";
    return "Heuristic";
    //  } else if (solution_source == kSolutionSourceInitial) {
    //    if (code) return "I";
    //    return "Initial";
  } else if (solution_source == kSolutionSourceSubMip) {
    if (code) return "L";
    return "Sub-MIP";
  } else if (solution_source == kSolutionSourceEmptyMip) {
    if (code) return "P";
    return "Empty MIP";
  } else if (solution_source == kSolutionSourceRandomizedRounding) {
    if (code) return "R";
    return "Randomized rounding";
  } else if (solution_source == kSolutionSourceSolveLp) {
    if (code) return "S";
    return "Solve LP";
  } else if (solution_source == kSolutionSourceEvaluateNode) {
    if (code) return "T";
    return "Evaluate node";
  } else if (solution_source == kSolutionSourceUnbounded) {
    if (code) return "U";
    return "Unbounded";
  } else if (solution_source == kSolutionSourceTrivialZ) {
    if (code) return "z";
    return "Trivial zero";
  } else if (solution_source == kSolutionSourceTrivialL) {
    if (code) return "l";
    return "Trivial lower";
  } else if (solution_source == kSolutionSourceTrivialU) {
    if (code) return "u";
    return "Trivial upper";
  } else if (solution_source == kSolutionSourceTrivialP) {
    if (code) return "p";
    return "Trivial point";
  } else if (solution_source == kSolutionSourceUserSolution) {
    if (code) return "X";
    return "User solution";
  } else if (solution_source == kSolutionSourceCleanup) {
    if (code) return " ";
    return "";
  } else {
    printf("HighsMipSolverData::solutionSourceToString: Unknown source = %d\n",
           solution_source);
    assert(0 == 111);
    if (code) return "*";
    return "None";
  }
}